

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks>::
find<kj::HashMap<kj::StringPtr,unsigned_short>::Entry_const,capnp::Text::Reader&>
          (HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks> *this,
          ArrayPtr<const_kj::HashMap<kj::StringPtr,_unsigned_short>::Entry> table,Reader *params)

{
  long lVar1;
  void *__s2;
  long lVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint *puVar7;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar8;
  Entry *pEVar9;
  undefined8 *in_R8;
  uint uVar10;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  ArrayPtr<const_unsigned_char> s;
  Maybe<unsigned_long> MVar14;
  Maybe<unsigned_long> MVar15;
  
  MVar15.ptr.field_1.value = table.size_;
  pEVar9 = table.ptr;
  if (pEVar9[1].key.content.ptr == (char *)0x0) {
    *this = (HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks>)0x0;
    MVar15.ptr._0_8_ = this;
    return (Maybe<unsigned_long>)MVar15.ptr;
  }
  s.size_ = in_R8[1] - 1;
  s.ptr = (uchar *)*in_R8;
  uVar4 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,s);
  uVar5 = kj::_::chooseBucket((uint)(uVar4 != 0),*(uint *)&pEVar9[1].key.content.ptr);
  lVar1 = *(long *)&pEVar9->value;
  uVar13 = (ulong)uVar5;
  uVar10 = *(uint *)(lVar1 + 4 + uVar13 * 8);
  aVar8 = extraout_RDX;
  if (uVar10 != 0) {
    puVar7 = (uint *)(lVar1 + uVar13 * 8);
    __s2 = (void *)*in_R8;
    lVar2 = in_R8[1];
    pcVar3 = pEVar9[1].key.content.ptr;
    do {
      if (((uVar10 != 1) && (*puVar7 == (uint)(uVar4 != 0))) &&
         (uVar11 = (ulong)(uVar10 - 2),
         *(long *)(MVar15.ptr.field_1.value + 8 + uVar11 * 0x18) == lVar2)) {
        iVar6 = bcmp(*(void **)(MVar15.ptr.field_1.value + uVar11 * 0x18),__s2,lVar2 - 1);
        aVar8.value = 0;
        if (iVar6 == 0) {
          *this = (HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks>)0x1;
          *(ulong *)(this + 8) = uVar11;
          goto LAB_001f444f;
        }
      }
      aVar8.value = 0;
      pcVar12 = (char *)(uVar13 + 1);
      uVar13 = (ulong)pcVar12 & 0xffffffff;
      if (pcVar12 == pcVar3) {
        uVar13 = 0;
      }
      puVar7 = (uint *)(lVar1 + uVar13 * 8);
      uVar10 = puVar7[1];
    } while (uVar10 != 0);
  }
  *this = (HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks>)0x0;
LAB_001f444f:
  MVar14.ptr.field_1.value = aVar8.value;
  MVar14.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar14.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }